

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::ClearDepthStencil
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,ITextureView *pView)

{
  undefined *puVar1;
  bool bVar2;
  COMMAND_QUEUE_TYPE CVar3;
  Char *pCVar4;
  TextureViewGLImpl *pTVar5;
  RenderPassGLImpl *pRVar6;
  RenderDeviceGLImpl *this_00;
  RenderDeviceInfo *this_01;
  undefined8 uVar7;
  COMMAND_QUEUE_TYPE Type;
  char *in_R8;
  char (*in_R9) [8];
  char (*in_stack_fffffffffffffe58) [97];
  code *pcVar8;
  undefined1 local_158 [8];
  string _msg_1;
  string _msg;
  string msg_5;
  undefined1 local_f0 [8];
  string msg_4;
  TextureViewDesc *ViewDesc;
  undefined1 local_a8 [8];
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  ITextureView *pView_local;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._8_8_ = pView;
  if (pView == (ITextureView *)0x0) {
    FormatString<char[45]>
              ((string *)local_38,(char (*) [45])"Depth-stencil view to clear must not be null");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"ClearDepthStencil",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x631);
    std::__cxx11::string::~string((string *)local_38);
  }
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar2 = IsDeferred(this);
    if (!bVar2) {
      FormatString<char[79]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"ClearDepthStencil",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x633);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    FormatString<char[97]>
              ((string *)((long)&msg_3.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"ClearDepthStencil",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x633);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  CVar3 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
  if (CVar3 != COMMAND_QUEUE_TYPE_GRAPHICS) {
    GetCommandQueueTypeString_abi_cxx11_
              ((String *)&ViewDesc,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    in_R8 = " queue.";
    FormatString<char[18],char[22],std::__cxx11::string,char[8]>
              ((string *)local_a8,(Diligent *)"ClearDepthStencil",(char (*) [18])0xf4cb59,
               (char (*) [22])&ViewDesc,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)&ViewDesc);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"ClearDepthStencil",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x633);
    std::__cxx11::string::~string((string *)local_a8);
  }
  msg_4.field_2._8_8_ = (**(code **)(*(long *)msg.field_2._8_8_ + 0x20))();
  if (*(char *)(msg_4.field_2._8_8_ + 8) != '\x03') {
    msg_5.field_2._8_8_ = GetTexViewTypeLiteralName(*(TEXTURE_VIEW_TYPE *)(msg_4.field_2._8_8_ + 8))
    ;
    in_R8 = (char *)msg_4.field_2._8_8_;
    FormatString<char[11],char_const*,char[24],char_const*,char[97]>
              ((string *)local_f0,(Diligent *)"The type (",(char (*) [11])((long)&msg_5.field_2 + 8)
               ,(char **)") of the texture view \'",(char (*) [24])msg_4.field_2._8_8_,
               (char **)
               "\' is invalid: ClearDepthStencil command expects depth-stencil view (TEXTURE_VIEW_DEPTH_STENCIL)."
               ,in_stack_fffffffffffffe58);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"ClearDepthStencil",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x63a);
    std::__cxx11::string::~string((string *)local_f0);
  }
  uVar7 = msg.field_2._8_8_;
  pTVar5 = Diligent::RefCntAutoPtr::operator_cast_to_TextureViewGLImpl_
                     ((RefCntAutoPtr *)&this->m_pBoundDepthStencil);
  if ((TextureViewGLImpl *)uVar7 != pTVar5) {
    pRVar6 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassGLImpl_
                       ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
    if (pRVar6 != (RenderPassGLImpl *)0x0) {
      FormatString<char[21],char_const*,char[158]>
                ((string *)((long)&_msg.field_2 + 8),(Diligent *)"Depth-stencil view \'",
                 (char (*) [21])msg_4.field_2._8_8_,
                 (char **)
                 "\' is not bound as framebuffer attachment. ClearDepthStencil command inside a render pass requires depth-stencil view to be bound as a framebuffer attachment."
                 ,(char (*) [158])in_R8);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"ClearDepthStencil",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x641);
      std::__cxx11::string::~string((string *)(_msg.field_2._M_local_buf + 8));
    }
    this_00 = RefCntAutoPtr<Diligent::RenderDeviceGLImpl>::operator->(&this->m_pDevice);
    this_01 = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetDeviceInfo
                        (&this_00->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
    bVar2 = RenderDeviceInfo::IsGLDevice(this_01);
    if (bVar2) {
      FormatString<char[21],char_const*,char[141]>
                ((string *)((long)&_msg_1.field_2 + 8),(Diligent *)"Depth-stencil view \'",
                 (char (*) [21])msg_4.field_2._8_8_,
                 (char **)
                 "\' is not bound to the device context. ClearDepthStencil command requires depth-stencil view be bound to the device context in OpenGL backend"
                 ,(char (*) [141])in_R8);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar7 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar7,0);
      }
      std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
    }
    else {
      FormatString<char[21],char_const*,char[186]>
                ((string *)local_158,(Diligent *)"Depth-stencil view \'",
                 (char (*) [21])msg_4.field_2._8_8_,
                 (char **)
                 "\' is not bound to the device context. ClearDepthStencil command is more efficient when depth-stencil view is bound to the context. In OpenGL, Metal and WebGPU backends this is required."
                 ,(char (*) [186])in_R8);
      if (DebugMessageCallback != (undefined *)0x0) {
        pcVar8 = (code *)DebugMessageCallback;
        uVar7 = std::__cxx11::string::c_str();
        (*pcVar8)(1,uVar7,0);
      }
      std::__cxx11::string::~string((string *)local_158);
    }
  }
  (this->m_Stats).CommandCounters.ClearDepthStencil =
       (this->m_Stats).CommandCounters.ClearDepthStencil + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::ClearDepthStencil(ITextureView* pView)
{
    DEV_CHECK_ERR(pView != nullptr, "Depth-stencil view to clear must not be null");

    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "ClearDepthStencil");

#ifdef DILIGENT_DEVELOPMENT
    {
        const TextureViewDesc& ViewDesc = pView->GetDesc();
        DEV_CHECK_ERR(ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL,
                      "The type (", GetTexViewTypeLiteralName(ViewDesc.ViewType), ") of the texture view '", ViewDesc.Name,
                      "' is invalid: ClearDepthStencil command expects depth-stencil view (TEXTURE_VIEW_DEPTH_STENCIL).");

        if (pView != m_pBoundDepthStencil)
        {
            DEV_CHECK_ERR(m_pActiveRenderPass == nullptr,
                          "Depth-stencil view '", ViewDesc.Name,
                          "' is not bound as framebuffer attachment. ClearDepthStencil command inside a render pass "
                          "requires depth-stencil view to be bound as a framebuffer attachment.");

            if (m_pDevice->GetDeviceInfo().IsGLDevice())
            {
                LOG_ERROR_MESSAGE("Depth-stencil view '", ViewDesc.Name,
                                  "' is not bound to the device context. ClearDepthStencil command requires "
                                  "depth-stencil view be bound to the device context in OpenGL backend");
            }
            else
            {
                LOG_DVP_WARNING_MESSAGE("Depth-stencil view '", ViewDesc.Name,
                                        "' is not bound to the device context. "
                                        "ClearDepthStencil command is more efficient when depth-stencil "
                                        "view is bound to the context. In OpenGL, Metal and WebGPU backends this is required.");
            }
        }
    }
#endif

    ++m_Stats.CommandCounters.ClearDepthStencil;
}